

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcConnectedFaceSet::~IfcConnectedFaceSet(IfcConnectedFaceSet *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].field_0x40 = &PTR__IfcConnectedFaceSet_0085a568;
  *(undefined ***)&(this->super_IfcTopologicalRepresentationItem).field_0x28 =
       &PTR__IfcConnectedFaceSet_0085a5e0;
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcConnectedFaceSet_0085a590;
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcConnectedFaceSet_0085a5b8;
  pvVar1 = *(void **)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcTopologicalRepresentationItem).
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].field_0x40,0x60);
  return;
}

Assistant:

IfcConnectedFaceSet() : Object("IfcConnectedFaceSet") {}